

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint _c;
  pointer pMVar5;
  size_t _elemsize;
  void *pvVar6;
  pointer pMVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  size_t i_1;
  void *pvVar14;
  void *__src;
  int iVar15;
  int _c_00;
  long lVar16;
  int iVar17;
  int iVar18;
  size_t i_2;
  void *__dest;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int j;
  size_t i;
  ulong uVar22;
  bool bVar23;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar5->dims;
  _elemsize = pMVar5->elemsize;
  pvVar6 = (this->slices).data;
  if (uVar2 == 1) {
    iVar18 = pMVar5->w;
    lVar20 = 0;
    lVar16 = 0;
    uVar22 = 0;
    iVar13 = 0;
    while( true ) {
      pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
      if (uVar8 <= uVar22) break;
      iVar15 = *(int *)((long)pvVar6 + uVar22 * 4);
      if (iVar15 == -0xe9) {
        iVar15 = (int)((ulong)((long)iVar18 - (long)iVar13) / (uVar8 + lVar20));
      }
      Mat::create((Mat *)((long)&pMVar7->data + lVar16),iVar15,_elemsize,opt->blob_allocator);
      pvVar14 = *(void **)((long)&pMVar7->data + lVar16);
      if ((pvVar14 == (void *)0x0) ||
         ((long)*(int *)((long)&pMVar7->c + lVar16) * *(long *)((long)&pMVar7->cstep + lVar16) == 0)
         ) {
        return -100;
      }
      memcpy(pvVar14,(void *)(_elemsize * (long)iVar13 + (long)pMVar5->data),
             (long)iVar15 * _elemsize);
      iVar13 = iVar13 + iVar15;
      uVar22 = uVar22 + 1;
      lVar16 = lVar16 + 0x48;
      lVar20 = lVar20 + -1;
    }
  }
  else {
    iVar18 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar18 == 0)) {
      iVar18 = pMVar5->w;
      iVar13 = pMVar5->h;
      lVar20 = 0;
      lVar16 = 0;
      uVar22 = 0;
      iVar15 = 0;
      while( true ) {
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
        if (uVar8 <= uVar22) break;
        iVar17 = *(int *)((long)pvVar6 + uVar22 * 4);
        if (iVar17 == -0xe9) {
          iVar17 = (int)((ulong)((long)iVar13 - (long)iVar15) / (uVar8 + lVar20));
        }
        Mat::create((Mat *)((long)&pMVar7->data + lVar16),iVar18,iVar17,_elemsize,
                    opt->blob_allocator);
        pvVar14 = *(void **)((long)&pMVar7->data + lVar16);
        if (pvVar14 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar7->c + lVar16) * *(long *)((long)&pMVar7->cstep + lVar16) ==
            0) {
          return -100;
        }
        memcpy(pvVar14,(void *)((long)pMVar5->w * (long)iVar15 * pMVar5->elemsize +
                               (long)pMVar5->data),(long)(iVar17 * iVar18) * _elemsize);
        iVar15 = iVar15 + iVar17;
        uVar22 = uVar22 + 1;
        lVar16 = lVar16 + 0x48;
        lVar20 = lVar20 + -1;
      }
    }
    else if ((uVar2 == 2) && (iVar18 == 1)) {
      iVar18 = pMVar5->w;
      uVar2 = pMVar5->h;
      uVar22 = 0;
      if (0 < (int)uVar2) {
        uVar22 = (ulong)uVar2;
      }
      uVar8 = 0;
      iVar13 = 0;
      while( true ) {
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
        uVar10 = uVar9 - uVar8;
        if (uVar9 < uVar8 || uVar10 == 0) break;
        iVar15 = *(int *)((long)pvVar6 + uVar8 * 4);
        if (iVar15 == -0xe9) {
          iVar15 = (int)((ulong)((long)iVar18 - (long)iVar13) / uVar10);
        }
        pMVar1 = pMVar7 + uVar8;
        Mat::create(pMVar1,iVar15,uVar2,_elemsize,opt->blob_allocator);
        if (pMVar7[uVar8].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar9 = 0; uVar22 != uVar9; uVar9 = uVar9 + 1) {
          memcpy((void *)((long)pMVar1->w * uVar9 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)pMVar5->data +
                         (long)iVar13 * _elemsize + (long)pMVar5->w * uVar9 * pMVar5->elemsize),
                 (long)iVar15 * _elemsize);
        }
        iVar13 = iVar15 + iVar13;
        uVar8 = uVar8 + 1;
      }
    }
    else if ((uVar2 - 3 < 2) && (iVar18 == 0)) {
      iVar18 = pMVar5->w;
      iVar13 = pMVar5->h;
      iVar15 = pMVar5->d;
      iVar17 = pMVar5->c;
      lVar20 = 0;
      lVar16 = 0;
      uVar22 = 0;
      iVar19 = 0;
      while( true ) {
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
        if (uVar8 <= uVar22) break;
        _c_00 = *(int *)((long)pvVar6 + uVar22 * 4);
        if (_c_00 == -0xe9) {
          _c_00 = (int)((ulong)((long)iVar17 - (long)iVar19) / (uVar8 + lVar20));
        }
        Mat::create((Mat *)((long)&pMVar7->data + lVar16),iVar18,iVar13,iVar15,_c_00,_elemsize,
                    opt->blob_allocator);
        pvVar14 = *(void **)((long)&pMVar7->data + lVar16);
        if (pvVar14 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar7->c + lVar16) * *(long *)((long)&pMVar7->cstep + lVar16) ==
            0) {
          return -100;
        }
        *(uint *)((long)&pMVar7->dims + lVar16) = uVar2;
        memcpy(pvVar14,(void *)(pMVar5->cstep * (long)iVar19 * pMVar5->elemsize + (long)pMVar5->data
                               ),(long)(_c_00 * (int)pMVar5->cstep) * _elemsize);
        iVar19 = iVar19 + _c_00;
        uVar22 = uVar22 + 1;
        lVar16 = lVar16 + 0x48;
        lVar20 = lVar20 + -1;
      }
    }
    else if (((uVar2 == 3) && (iVar18 == 1)) || ((uVar2 == 4 && (iVar18 == 2)))) {
      iVar18 = pMVar5->w;
      uVar3 = pMVar5->d;
      iVar13 = pMVar5->h;
      uVar4 = pMVar5->c;
      uVar22 = 0;
      if (0 < (int)uVar3) {
        uVar22 = (ulong)uVar3;
      }
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      uVar9 = 0;
      iVar15 = 0;
      while( true ) {
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
        uVar11 = uVar10 - uVar9;
        if (uVar10 < uVar9 || uVar11 == 0) break;
        iVar17 = *(int *)((long)pvVar6 + uVar9 * 4);
        if (iVar17 == -0xe9) {
          iVar17 = (int)((ulong)((long)iVar13 - (long)iVar15) / uVar11);
        }
        pMVar1 = pMVar7 + uVar9;
        Mat::create(pMVar1,iVar18,iVar17,uVar3,uVar4,_elemsize,opt->blob_allocator);
        if (pMVar7[uVar9].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        pMVar1->dims = uVar2;
        for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
          for (uVar11 = 0; uVar22 != uVar11; uVar11 = uVar11 + 1) {
            lVar16 = (long)pMVar5->w * pMVar5->elemsize;
            memcpy((void *)((long)pMVar1->data +
                           (long)pMVar1->h * pMVar1->elemsize * (long)pMVar1->w * uVar11 +
                           pMVar1->cstep * uVar10 * pMVar1->elemsize),
                   (void *)((long)pMVar5->data +
                           lVar16 * iVar15 + (long)pMVar5->h * uVar11 * lVar16 +
                           pMVar5->cstep * uVar10 * pMVar5->elemsize),
                   (long)(iVar17 * iVar18) * _elemsize);
          }
        }
        iVar15 = iVar17 + iVar15;
        uVar9 = uVar9 + 1;
      }
    }
    else if ((uVar2 == 3 && iVar18 == 2) || (iVar18 == 3 && uVar2 == 4)) {
      iVar18 = pMVar5->w;
      uVar3 = pMVar5->h;
      uVar4 = pMVar5->d;
      _c = pMVar5->c;
      uVar22 = 0;
      if (0 < (int)uVar3) {
        uVar22 = (ulong)uVar3;
      }
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      uVar9 = 0;
      if (0 < (int)_c) {
        uVar9 = (ulong)_c;
      }
      iVar13 = 0;
      uVar10 = 0;
      while( true ) {
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
        uVar12 = uVar11 - uVar10;
        if (uVar11 < uVar10 || uVar12 == 0) break;
        iVar15 = *(int *)((long)pvVar6 + uVar10 * 4);
        if (iVar15 == -0xe9) {
          iVar15 = (int)((ulong)((long)iVar18 - (long)iVar13) / uVar12);
        }
        pMVar1 = pMVar7 + uVar10;
        Mat::create(pMVar1,iVar15,uVar3,uVar4,_c,_elemsize,opt->blob_allocator);
        if (pMVar7[uVar10].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        pMVar1->dims = uVar2;
        for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
          __dest = (void *)(pMVar1->cstep * uVar11 * pMVar1->elemsize + (long)pMVar1->data);
          iVar17 = pMVar5->h;
          pvVar14 = (void *)((long)pMVar5->data +
                            pMVar5->cstep * pMVar5->elemsize * uVar11 + (long)iVar13 * _elemsize);
          lVar16 = (long)pMVar5->w * pMVar5->elemsize;
          for (uVar12 = 0; __src = pvVar14, uVar21 = uVar22, uVar12 != uVar8; uVar12 = uVar12 + 1) {
            while (bVar23 = uVar21 != 0, uVar21 = uVar21 - 1, bVar23) {
              memcpy(__dest,__src,(long)iVar15 * _elemsize);
              __dest = (void *)((long)__dest + (long)iVar15 * _elemsize);
              __src = (void *)((long)__src + lVar16);
            }
            pvVar14 = (void *)((long)pvVar14 + iVar17 * lVar16);
          }
        }
        iVar13 = iVar15 + iVar13;
        uVar10 = uVar10 + 1;
      }
    }
    else {
      if (uVar2 != 4) {
        return 0;
      }
      if (iVar18 != 1) {
        return 0;
      }
      iVar18 = pMVar5->w;
      iVar13 = pMVar5->h;
      iVar15 = pMVar5->d;
      uVar2 = pMVar5->c;
      uVar22 = 0;
      if (0 < (int)uVar2) {
        uVar22 = (ulong)uVar2;
      }
      iVar17 = 0;
      uVar8 = 0;
      while( true ) {
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48;
        uVar10 = uVar9 - uVar8;
        if (uVar9 < uVar8 || uVar10 == 0) break;
        iVar19 = *(int *)((long)pvVar6 + uVar8 * 4);
        if (iVar19 == -0xe9) {
          iVar19 = (int)((ulong)((long)iVar15 - (long)iVar17) / uVar10);
        }
        pMVar1 = pMVar7 + uVar8;
        Mat::create(pMVar1,iVar18,iVar13,iVar19,uVar2,_elemsize,opt->blob_allocator);
        if (pMVar7[uVar8].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar9 = 0; uVar22 != uVar9; uVar9 = uVar9 + 1) {
          memcpy((void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)pMVar5->data +
                         (long)pMVar5->h * pMVar5->elemsize * (long)pMVar5->w * (long)iVar17 +
                         pMVar5->cstep * uVar9 * pMVar5->elemsize),
                 (long)(iVar13 * iVar18 * iVar19) * _elemsize);
        }
        iVar17 = iVar19 + iVar17;
        uVar8 = uVar8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((d - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}